

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenmesh::fillcavity
          (tetgenmesh *this,arraypool *topshells,arraypool *botshells,arraypool *midfaces,
          arraypool *missingshs,arraypool *topnewtets,arraypool *botnewtets,triface *crossedge)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tetrahedron P;
  tetrahedron Q;
  double *pdVar6;
  double *pd;
  shellface ppdVar7;
  shellface ppdVar8;
  shellface ppdVar9;
  shellface ppdVar10;
  shellface *pppdVar11;
  shellface ppdVar12;
  memorypool *pmVar13;
  undefined8 *puVar14;
  bool bVar15;
  bool bVar16;
  int i;
  int iVar17;
  uint uVar18;
  unsigned_long uVar19;
  char *pcVar20;
  void *pvVar21;
  long lVar22;
  undefined4 *puVar23;
  arraypool *paVar24;
  uint uVar25;
  ulong uVar26;
  point B;
  ulong uVar27;
  int iVar28;
  ulong *puVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  int *piVar34;
  long lVar35;
  point A;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  bool bVar44;
  double dVar45;
  face local_68;
  int types [2];
  int poss [4];
  
  bVar44 = true;
  do {
    bVar16 = bVar44;
    paVar24 = botshells;
    if (bVar16) {
      paVar24 = topshells;
    }
    if ((paVar24 != (arraypool *)0x0) && (lVar30 = paVar24->objects, 0 < lVar30)) {
      lVar32 = 0;
      do {
        lVar35 = (long)paVar24->objectbytes *
                 (long)(int)(paVar24->objectsperblockmark & (uint)lVar32);
        puVar29 = *(ulong **)
                   (paVar24->toparray[(uint)lVar32 >> ((byte)paVar24->log2objectsperblock & 0x1f)] +
                   lVar35);
        uVar36 = *(uint *)(paVar24->toparray
                           [(uint)lVar32 >> ((byte)paVar24->log2objectsperblock & 0x1f)] +
                          lVar35 + 8);
        uVar26 = puVar29[(ulong)(uVar36 & 1) + 9];
        uVar42 = (uint)uVar26 & 0xf;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        if (uVar26 != 0) {
          uVar42 = stpivottbl[uVar42][(int)uVar36];
        }
        uVar38 = *puVar29;
        uVar39 = uVar38 & 0xfffffffffffffff0;
        uVar18 = (uint)uVar38;
        uVar36 = uVar18 & 0xf;
        uVar38 = (ulong)(uVar36 * 4);
        lVar35 = *(long *)(uVar39 + (long)*(int *)((long)orgpivot + uVar38) * 8);
        lVar37 = *(long *)(uVar39 + (long)*(int *)((long)destpivot + uVar38) * 8);
        lVar22 = *(long *)(uVar39 + (long)*(int *)((long)apexpivot + uVar38) * 8);
        puVar1 = (uint *)(uVar26 + (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 | 1;
        *(ulong *)(uVar39 + (ulong)(uVar18 & 3) * 8) =
             (long)*(int *)((long)bondtbl[0] + (long)(int)uVar42 * 4 + (ulong)(uVar36 * 0x30)) |
             uVar26;
        *(ulong *)(uVar26 + (ulong)(uVar42 & 3) * 8) = (long)bondtbl[(int)uVar42][uVar36] | uVar39;
        if (*(long *)(uVar26 + 0x48) != 0) {
          *(undefined8 *)(*(long *)(uVar26 + 0x48) + (ulong)(uVar42 & 3) * 8) = 0;
        }
        lVar40 = (long)this->point2simindex;
        *(ulong *)(lVar35 + lVar40 * 8) = uVar26;
        *(ulong *)(lVar37 + lVar40 * 8) = uVar26;
        *(ulong *)(lVar22 + lVar40 * 8) = uVar26;
        lVar32 = lVar32 + 1;
      } while (lVar30 != lVar32);
    }
    bVar44 = false;
  } while (bVar16);
  bVar44 = true;
  bVar16 = true;
  if (crossedge == (triface *)0x0) goto LAB_001362cf;
  uVar36 = 0;
  if (0 < topnewtets->objects) {
    P = crossedge->tet[orgpivot[crossedge->ver]];
    Q = crossedge->tet[destpivot[crossedge->ver]];
    lVar30 = 0;
    uVar26 = 0;
    do {
      uVar38 = *(ulong *)(topnewtets->toparray
                          [(uint)lVar30 >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                         (long)topnewtets->objectbytes *
                         (long)(int)(topnewtets->objectsperblockmark & (uint)lVar30));
      uVar39 = 0;
      do {
        A = *(point *)(uVar38 + (long)orgpivot[uVar39] * 8);
        lVar32 = (long)this->pointmarkindex;
        if (((((*(byte *)((long)A + lVar32 * 4 + 4) & 2) != 0) &&
             (B = *(point *)(uVar38 + (long)destpivot[uVar39] * 8),
             (*(byte *)((long)B + lVar32 * 4 + 4) & 2) != 0)) &&
            (pdVar6 = *(double **)(uVar38 + (long)apexpivot[uVar39] * 8),
            (*(byte *)((long)pdVar6 + lVar32 * 4 + 4) & 2) != 0)) &&
           (iVar17 = tri_edge_test(this,A,B,pdVar6,(point)P,(point)Q,(point)0x0,1,types,poss),
           iVar17 == 2)) {
          dVar45 = orient3d(A,B,pdVar6,(double *)P);
          if (0.0 <= dVar45) {
            uVar26 = uVar39 & 0xffffffff;
            uVar41 = uVar38;
            if ((dVar45 == 0.0) && (!NAN(dVar45))) goto LAB_00136272;
          }
          else {
            uVar26 = *(ulong *)(uVar38 + uVar39 * 8);
            uVar41 = uVar26 & 0xfffffffffffffff0;
            uVar26 = (ulong)fsymtbl[uVar39][(uint)uVar26 & 0xf];
            A = *(point *)(uVar41 + (long)orgpivot[uVar26] * 8);
            B = *(point *)(uVar41 + (long)destpivot[uVar26] * 8);
          }
          uVar36 = (uint)uVar26;
          if (0 < botnewtets->objects) {
            lVar32 = 0;
            do {
              uVar27 = *(ulong *)(botnewtets->toparray
                                  [(uint)lVar32 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                                 (long)(int)((uint)lVar32 & botnewtets->objectsperblockmark) *
                                 (long)botnewtets->objectbytes);
              if (*(point *)(uVar27 + 0x20) == B) {
                uVar33 = 0xb;
LAB_0013558f:
                if (*(point *)(uVar27 + (long)destpivot[uVar33] * 8) != A) {
                  if (*(point *)(uVar27 + (long)apexpivot[uVar33] * 8) == A) {
                    piVar34 = eprevesymtbl;
                  }
                  else {
                    if (*(point *)(uVar27 + (long)oppopivot[uVar33] * 8) != A) goto LAB_0013560e;
                    uVar33 = (ulong)esymtbl[uVar33];
                    piVar34 = enexttbl;
                  }
                  uVar33 = (ulong)(uint)piVar34[uVar33];
                }
                uVar42 = (uint)uVar33;
                if (*(double **)(uVar27 + (long)apexpivot[(int)uVar42] * 8) == pdVar6) {
                  *(ulong *)(uVar41 + (ulong)(uVar36 & 3) * 8) =
                       (long)bondtbl[(int)uVar36][(int)uVar42] | uVar27;
                  *(ulong *)(uVar27 + (ulong)(uVar42 & 3) * 8) =
                       (long)bondtbl[(int)uVar42][(int)uVar36] | uVar41;
                  puVar1 = (uint *)(uVar41 + (long)this->elemmarkerindex * 4);
                  *puVar1 = *puVar1 | 1;
                  puVar1 = (uint *)(uVar27 + (long)this->elemmarkerindex * 4);
                  *puVar1 = *puVar1 | 1;
                  puVar1 = (uint *)(uVar41 + (long)this->elemmarkerindex * 4);
                  *puVar1 = *puVar1 | 4 << (sbyte)(uVar36 & 3);
                  pcVar20 = arraypool::getblock(midfaces,(int)midfaces->objects);
                  lVar32 = (long)midfaces->objectbytes *
                           ((long)midfaces->objectsperblock - 1U & midfaces->objects);
                  lVar30 = midfaces->objects + 1;
                  midfaces->objects = lVar30;
                  *(ulong *)(pcVar20 + lVar32) = uVar41;
                  *(uint *)(pcVar20 + lVar32 + 8) = uVar36;
                  bVar44 = true;
                  goto LAB_0013576e;
                }
              }
              else {
                if (*(point *)(uVar27 + 0x28) == B) {
                  uVar33 = 3;
                  goto LAB_0013558f;
                }
                if (*(point *)(uVar27 + 0x30) == B) {
                  uVar33 = 7;
                  goto LAB_0013558f;
                }
                if (*(point *)(uVar27 + 0x38) == B) {
                  uVar33 = 0;
                  goto LAB_0013558f;
                }
              }
LAB_0013560e:
              lVar32 = lVar32 + 1;
            } while (botnewtets->objects != lVar32);
          }
        }
        uVar36 = (uint)uVar26;
        bVar44 = uVar39 < 3;
        uVar39 = uVar39 + 1;
      } while (bVar44);
      lVar30 = lVar30 + 1;
    } while (lVar30 < topnewtets->objects);
  }
  uVar19 = randomnation(this,(int)missingshs->objects - 1);
  pcVar20 = missingshs->toparray
            [(int)(uint)uVar19 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
  lVar30 = (long)missingshs->objectbytes *
           (long)(int)((uint)uVar19 & missingshs->objectsperblockmark);
  (this->recentsh).sh = *(shellface **)(pcVar20 + lVar30);
  (this->recentsh).shver = *(int *)(pcVar20 + lVar30 + 8);
  lVar30 = midfaces->objects;
  bVar44 = false;
  uVar27 = 0;
  uVar41 = 0;
  uVar33 = 0;
LAB_0013576e:
  iVar17 = (int)uVar33;
  if ((bool)(0 < lVar30 & bVar44)) {
    if (bVar44) {
      puVar29 = (ulong *)*midfaces->toparray;
      lVar30 = 0;
LAB_001357a4:
      uVar42 = (uint)puVar29[1];
      uVar18 = 0;
LAB_001357b4:
      lVar32 = (long)this->pointmarkindex;
      lVar35 = (long)this->elemmarkerindex;
      uVar41 = *puVar29;
      uVar36 = uVar42;
      do {
        uVar36 = esymtbl[(int)uVar36];
        pdVar6 = *(double **)(uVar41 + (long)apexpivot[(int)uVar36] * 8);
        if ((*(byte *)((long)pdVar6 + lVar32 * 4 + 4) & 2) != 0) {
          uVar25 = *(uint *)(uVar41 + lVar35 * 4);
          uVar31 = 4 << (sbyte)(uVar36 & 3);
          if ((uVar25 & uVar31) == 0) {
            uVar26 = *(ulong *)(*puVar29 + (ulong)(uVar42 & 3) * 8);
            uVar38 = uVar26 & 0xfffffffffffffff0;
            iVar17 = fsymtbl[(int)uVar42][(uint)uVar26 & 0xf];
            lVar37 = (long)iVar17;
            uVar27 = uVar38;
            goto LAB_0013588d;
          }
          break;
        }
        if (pdVar6 == this->dummypoint) goto LAB_00136272;
        uVar26 = *(ulong *)(uVar41 + (ulong)(uVar36 & 3) * 8);
        uVar41 = uVar26 & 0xfffffffffffffff0;
        uVar36 = fsymtbl[(int)uVar36][(uint)uVar26 & 0xf];
      } while ((*(byte *)(uVar41 + lVar35 * 4) & 2) != 0);
      goto LAB_00135a4b;
    }
LAB_00136178:
    if (uVar41 != 0) {
      if (1 < missingshs->objects) {
        ppdVar7 = *(shellface *)(uVar41 + (long)orgpivot[(int)uVar36] * 8);
        ppdVar8 = *(shellface *)(uVar41 + (long)destpivot[(int)uVar36] * 8);
        ppdVar9 = *(shellface *)(uVar27 + (long)orgpivot[iVar17] * 8);
        ppdVar10 = *(shellface *)(uVar27 + (long)destpivot[iVar17] * 8);
        lVar30 = 1;
        do {
          lVar32 = (long)(int)((uint)lVar30 & missingshs->objectsperblockmark) *
                   (long)missingshs->objectbytes;
          pppdVar11 = *(shellface **)
                       (missingshs->toparray
                        [(uint)lVar30 >> ((byte)missingshs->log2objectsperblock & 0x1f)] + lVar32);
          iVar17 = *(int *)(missingshs->toparray
                            [(uint)lVar30 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
                           lVar32 + 8);
          ppdVar12 = pppdVar11[sorgpivot[iVar17]];
          if (((((ppdVar12 == ppdVar7) && (pppdVar11[sdestpivot[iVar17]] == ppdVar8)) ||
               ((ppdVar12 == ppdVar8 && (pppdVar11[sdestpivot[iVar17]] == ppdVar7)))) ||
              ((ppdVar12 == ppdVar9 && (pppdVar11[sdestpivot[iVar17]] == ppdVar10)))) ||
             ((ppdVar12 == ppdVar10 && (pppdVar11[sdestpivot[iVar17]] == ppdVar9)))) {
            (this->recentsh).sh = pppdVar11;
            (this->recentsh).shver = iVar17;
            goto LAB_001362bf;
          }
          lVar30 = lVar30 + 1;
        } while (missingshs->objects != lVar30);
      }
LAB_00136272:
      puVar23 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar23 = 2;
      __cxa_throw(puVar23,&int::typeinfo,0);
    }
LAB_001362bf:
    bVar44 = false;
  }
  else {
LAB_00135aed:
    if (!bVar44) goto LAB_00136178;
    if (2 < this->b->verbose) {
      printf("      Found %ld middle subfaces.\n");
    }
    local_68.sh = (shellface *)0x0;
    local_68.shver = 0;
    if (0 < midfaces->objects) {
      lVar30 = *(long *)*missingshs->toparray;
      lVar32 = 0;
      do {
        pcVar20 = midfaces->toparray[(uint)lVar32 >> ((byte)midfaces->log2objectsperblock & 0x1f)];
        lVar37 = (long)midfaces->objectbytes *
                 (long)(int)(midfaces->objectsperblockmark & (uint)lVar32);
        puVar1 = (uint *)(*(long *)(pcVar20 + lVar37) + (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & ~(4 << (pcVar20[lVar37 + 8] & 3U));
        makeshellface(this,this->subfaces,&local_68);
        iVar5 = local_68.shver;
        pppdVar11 = local_68.sh;
        iVar17 = *(int *)(pcVar20 + lVar37 + 8);
        lVar35 = (long)local_68.shver;
        local_68.sh[sorgpivot[lVar35]] =
             *(shellface *)(*(long *)(pcVar20 + lVar37) + (long)orgpivot[iVar17] * 8);
        local_68.sh[sdestpivot[lVar35]] =
             *(shellface *)(*(long *)(pcVar20 + lVar37) + (long)destpivot[iVar17] * 8);
        local_68.sh[sapexpivot[lVar35]] =
             *(shellface *)(*(long *)(pcVar20 + lVar37) + (long)apexpivot[iVar17] * 8);
        *(undefined4 *)((long)local_68.sh + (long)this->shmarkindex * 4) =
             *(undefined4 *)(lVar30 + (long)this->shmarkindex * 4);
        if (this->checkconstraints != 0) {
          local_68.sh[this->areaboundindex] =
               *(shellface *)(lVar30 + (long)this->areaboundindex * 8);
        }
        if (this->useinsertradius != 0) {
          *(undefined4 *)((long)local_68.sh + (long)this->shmarkindex * 4 + 8) =
               *(undefined4 *)(lVar30 + 8 + (long)this->shmarkindex * 4);
        }
        lVar22 = *(long *)(*(long *)(pcVar20 + lVar37) + 0x48);
        if (lVar22 == 0) {
          pvVar21 = memorypool::alloc(this->tet2subpool);
          *(void **)(*(long *)(pcVar20 + lVar37) + 0x48) = pvVar21;
          lVar22 = 0;
          do {
            *(undefined8 *)(*(long *)(*(long *)(pcVar20 + lVar37) + 0x48) + lVar22 * 8) = 0;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          lVar22 = *(long *)(*(long *)(pcVar20 + lVar37) + 0x48);
        }
        uVar36 = *(uint *)(pcVar20 + lVar37 + 8);
        uVar26 = (ulong)((uVar36 & 3) << 3);
        *(ulong *)(lVar22 + uVar26) = (long)tsbondtbl[(int)uVar36][lVar35] | (ulong)pppdVar11;
        pppdVar11[(ulong)(iVar5 & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar36][lVar35] | *(ulong *)(pcVar20 + lVar37));
        uVar26 = *(ulong *)(*(long *)(pcVar20 + lVar37) + uVar26);
        uVar38 = uVar26 & 0xfffffffffffffff0;
        uVar36 = fsymtbl[(int)uVar36][(uint)uVar26 & 0xf];
        uVar42 = iVar5 ^ 1;
        lVar35 = *(long *)(uVar38 + 0x48);
        local_68.shver = uVar42;
        if (lVar35 == 0) {
          pvVar21 = memorypool::alloc(this->tet2subpool);
          *(void **)(uVar38 + 0x48) = pvVar21;
          lVar35 = 0;
          do {
            *(undefined8 *)(*(long *)(uVar38 + 0x48) + lVar35 * 8) = 0;
            lVar35 = lVar35 + 1;
          } while (lVar35 != 4);
          lVar35 = *(long *)(uVar38 + 0x48);
        }
        *(ulong *)(lVar35 + (ulong)(uVar36 & 3) * 8) =
             (long)tsbondtbl[(int)uVar36][(int)uVar42] | (ulong)pppdVar11;
        pppdVar11[(ulong)(uVar42 & 1) + 9] =
             (shellface)(uVar38 | (long)stbondtbl[(int)uVar36][(int)uVar42]);
        lVar32 = lVar32 + 1;
        lVar35 = midfaces->objects;
      } while (lVar32 < lVar35);
      if (0 < lVar35) {
        iVar17 = midfaces->log2objectsperblock;
        uVar36 = midfaces->objectsperblockmark;
        iVar5 = midfaces->objectbytes;
        lVar30 = 0;
LAB_00135e2a:
        pcVar20 = midfaces->toparray[(uint)lVar30 >> ((byte)iVar17 & 0x1f)];
        lVar32 = (long)(int)((uint)lVar30 & uVar36) * (long)iVar5;
        iVar3 = this->shmarkindex;
        uVar18 = *(uint *)(pcVar20 + lVar32 + 8);
        iVar28 = 0;
LAB_00135e72:
        uVar26 = *(ulong *)(pcVar20 + lVar32);
        lVar37 = (long)(int)uVar18;
        if (*(long *)(uVar26 + 0x48) == 0) {
          uVar38 = 0;
        }
        else {
          uVar39 = *(ulong *)(*(long *)(uVar26 + 0x48) + (ulong)(uVar18 & 3) * 8);
          uVar38 = uVar39 & 0xfffffffffffffff8;
          uVar42 = tspivottbl[lVar37][(uint)uVar39 & 7];
        }
        lVar22 = lVar37;
        if (*(ulong *)(uVar38 + (long)((int)uVar42 >> 1) * 8) < 8) {
          do {
            do {
              uVar26 = *(ulong *)(uVar26 + (long)facepivot1[lVar22] * 8);
              uVar18 = facepivot2[lVar22][(uint)uVar26 & 0xf];
              lVar22 = (long)(int)uVar18;
              uVar26 = uVar26 & 0xfffffffffffffff0;
              if ((*(long *)(uVar26 + 0x40) != 0) &&
                 (puVar29 = (ulong *)(*(ulong *)(*(long *)(uVar26 + 0x40) +
                                                (long)ver2edge[lVar22] * 8) & 0xfffffffffffffff8),
                 puVar29 != (ulong *)0x0)) {
                uVar25 = (uint)*puVar29;
                uVar41 = *puVar29 & 0xfffffffffffffff8;
                uVar39 = uVar26;
                if ((*(byte *)((long)puVar29 + (long)iVar3 * 4 + 4) & 1) != 0) goto LAB_0013600c;
                uVar26 = *(ulong *)(uVar41 + (ulong)(uVar25 & 6) * 4);
                uVar39 = uVar26 & 0xfffffffffffffff8;
                if (uVar39 != 0) {
                  uVar42 = uVar42 ^ *(ulong *)(uVar38 + (long)sorgpivot[(int)uVar42] * 8) !=
                                    puVar29[sorgpivot[0]];
                  uVar27 = (ulong)((uint)(uVar26 >> 1) & 3);
                  uVar33 = *(ulong *)(uVar39 + uVar27 * 8);
                  while (uVar43 = uVar33 & 0xfffffffffffffff8, uVar43 != uVar41) {
                    uVar27 = (ulong)((uint)(uVar33 >> 1) & 3);
                    uVar39 = uVar43;
                    uVar33 = *(ulong *)(uVar43 + uVar27 * 8);
                  }
                  goto LAB_0013608d;
                }
                goto LAB_001360cc;
              }
            } while (*(long *)(uVar26 + 0x48) == 0);
            uVar39 = *(ulong *)(*(long *)(uVar26 + 0x48) + (ulong)(uVar18 & 3) * 8);
            uVar41 = uVar39 & 0xfffffffffffffff8;
          } while (uVar41 == 0);
          iVar4 = tspivottbl[lVar22][(uint)uVar39 & 7];
          *(ulong *)(uVar38 + (long)((int)uVar42 >> 1) * 8) = (long)iVar4 | uVar41;
          *(ulong *)(uVar41 + (long)(iVar4 >> 1) * 8) = (long)(int)uVar42 | uVar38;
        }
        goto LAB_00135f57;
      }
    }
LAB_0013610f:
    lVar30 = missingshs->objects;
    if (0 < lVar30) {
      iVar17 = missingshs->log2objectsperblock;
      uVar36 = missingshs->objectsperblockmark;
      iVar5 = missingshs->objectbytes;
      lVar32 = 0;
      do {
        pmVar13 = this->subfaces;
        puVar14 = *(undefined8 **)
                   (missingshs->toparray[(uint)lVar32 >> ((byte)iVar17 & 0x1f)] +
                   (long)(int)((uint)lVar32 & uVar36) * (long)iVar5);
        puVar14[3] = 0;
        *puVar14 = pmVar13->deaditemstack;
        pmVar13->deaditemstack = puVar14;
        pmVar13->items = pmVar13->items + -1;
        lVar32 = lVar32 + 1;
      } while (lVar30 != lVar32);
    }
  }
  midfaces->objects = 0;
  bVar16 = true;
LAB_001362cf:
  do {
    bVar15 = bVar16;
    paVar24 = botshells;
    if (bVar15) {
      paVar24 = topshells;
    }
    if ((paVar24 != (arraypool *)0x0) && (lVar30 = paVar24->objects, 0 < lVar30)) {
      iVar17 = paVar24->log2objectsperblock;
      uVar36 = paVar24->objectsperblockmark;
      iVar5 = paVar24->objectbytes;
      lVar32 = 0;
      do {
        pmVar13 = this->subfaces;
        puVar14 = *(undefined8 **)
                   (paVar24->toparray[(uint)lVar32 >> ((byte)iVar17 & 0x1f)] +
                   (long)(int)((uint)lVar32 & uVar36) * (long)iVar5);
        puVar14[3] = 0;
        *puVar14 = pmVar13->deaditemstack;
        pmVar13->deaditemstack = puVar14;
        pmVar13->items = pmVar13->items + -1;
        lVar32 = lVar32 + 1;
      } while (lVar30 != lVar32);
    }
    bVar16 = false;
  } while (bVar15);
  topshells->objects = 0;
  if (botshells != (arraypool *)0x0) {
    botshells->objects = 0;
  }
  return bVar44;
  while( true ) {
    uVar26 = *(ulong *)(uVar27 + (ulong)(uVar42 & 3) * 8);
    uVar27 = uVar26 & 0xfffffffffffffff0;
    iVar17 = fsymtbl[(int)uVar42][(uint)uVar26 & 0xf];
    if (uVar27 == uVar38) break;
LAB_0013588d:
    uVar42 = esymtbl[iVar17];
    if (*(double **)(uVar27 + (long)apexpivot[(int)uVar42] * 8) == pdVar6) {
      if (!bVar44) goto LAB_0013599b;
      if ((*(byte *)(uVar27 + lVar35 * 4) & 2) == 0) goto LAB_00136272;
      *(ulong *)(uVar41 + (ulong)(uVar36 & 3) * 8) =
           (long)bondtbl[(int)uVar36][(int)uVar42] | uVar27;
      *(ulong *)(uVar27 + (ulong)(uVar42 & 3) * 8) =
           (long)bondtbl[(int)uVar42][(int)uVar36] | uVar41;
      *(uint *)(uVar41 + lVar35 * 4) = uVar25 | 1;
      puVar1 = (uint *)(uVar27 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 | 1;
      puVar1 = (uint *)(uVar41 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 | uVar31;
      pcVar20 = arraypool::getblock(midfaces,(int)midfaces->objects);
      lVar32 = (long)midfaces->objectbytes *
               ((long)midfaces->objectsperblock - 1U & midfaces->objects);
      midfaces->objects = midfaces->objects + 1;
      *(ulong *)(pcVar20 + lVar32) = uVar41;
      *(uint *)(pcVar20 + lVar32 + 8) = uVar36;
      goto LAB_00135a3f;
    }
  }
  bVar44 = false;
LAB_0013599b:
  uVar42 = esymtbl[lVar37];
  lVar35 = (long)(int)uVar42;
  pd = *(double **)(uVar38 + (long)apexpivot[lVar35] * 8);
  bVar2 = *(byte *)((long)pd + lVar32 * 4 + 4);
  uVar27 = uVar38;
  while ((bVar2 & 2) == 0) {
    uVar26 = *(ulong *)(uVar27 + (ulong)(uVar42 & 3) * 8);
    uVar27 = uVar26 & 0xfffffffffffffff0;
    uVar42 = esymtbl[fsymtbl[lVar35][(uint)uVar26 & 0xf]];
    lVar35 = (long)(int)uVar42;
    pd = *(double **)(uVar27 + (long)apexpivot[lVar35] * 8);
    bVar2 = *(byte *)((long)pd + lVar32 * 4 + 4);
  }
  dVar45 = orient3d(*(double **)(uVar41 + (long)destpivot[(int)uVar36] * 8),pdVar6,
                    *(double **)(uVar41 + (long)oppopivot[(int)uVar36] * 8),pd);
  if (0.0 <= dVar45) {
    if (dVar45 <= 0.0) goto LAB_00136272;
    uVar36 = eprevtbl[(int)uVar36];
    uVar33 = (ulong)(uint)eprevtbl[lVar35];
  }
  else {
    uVar36 = enexttbl[(int)uVar36];
    uVar42 = enexttbl[lVar35];
LAB_00135a3f:
    uVar33 = (ulong)uVar42;
  }
LAB_00135a4b:
  iVar17 = (int)uVar33;
  uVar42 = enexttbl[(int)puVar29[1]];
  *(uint *)(puVar29 + 1) = uVar42;
  if ((1 < uVar18) || (uVar18 = uVar18 + 1, !bVar44)) goto LAB_00135aa1;
  goto LAB_001357b4;
LAB_00135aa1:
  lVar30 = lVar30 + 1;
  if ((midfaces->objects <= lVar30) || (!bVar44)) goto LAB_00135aed;
  puVar29 = (ulong *)(midfaces->toparray
                      [(uint)lVar30 >> ((byte)midfaces->log2objectsperblock & 0x1f)] +
                     (long)midfaces->objectbytes *
                     (long)(int)(midfaces->objectsperblockmark & (uint)lVar30));
  if (!bVar44) goto LAB_00136178;
  goto LAB_001357a4;
LAB_0013600c:
  do {
    if (*(long *)(uVar39 + 0x40) != 0) {
      *(undefined8 *)(*(long *)(uVar39 + 0x40) + (long)ver2edge[(int)uVar18] * 8) = 0;
    }
    uVar27 = *(ulong *)(uVar39 + (long)facepivot1[(int)uVar18] * 8);
    uVar39 = uVar27 & 0xfffffffffffffff0;
    uVar18 = facepivot2[(int)uVar18][(uint)uVar27 & 0xf];
  } while (uVar39 != uVar26);
  pmVar13 = this->subsegs;
  puVar29[3] = 0;
  *puVar29 = (ulong)pmVar13->deaditemstack;
  pmVar13->deaditemstack = puVar29;
  pmVar13->items = pmVar13->items + -1;
  uVar26 = (ulong)(uVar25 & 6);
  *(undefined8 *)(uVar41 + 0x30 + uVar26 * 4) = 0;
  uVar26 = *(ulong *)(uVar41 + uVar26 * 4);
  uVar39 = uVar26 & 0xfffffffffffffff8;
  if (uVar39 != 0) {
    uVar27 = (ulong)((uint)(uVar26 >> 1) & 3);
    puVar29 = (ulong *)0x0;
LAB_0013608d:
    *(ulong *)(uVar38 + (long)((int)uVar42 >> 1) * 8) = uVar26;
    *(ulong *)(uVar39 + uVar27 * 8) = (long)(int)uVar42 | uVar38;
    if (puVar29 != (ulong *)0x0) {
LAB_001360cc:
      *(ulong **)(uVar38 + 0x30 + (long)((int)uVar42 >> 1) * 8) = puVar29;
      *puVar29 = (long)(int)uVar42 | uVar38;
    }
  }
LAB_00135f57:
  uVar18 = enexttbl[lVar37];
  *(uint *)(pcVar20 + lVar32 + 8) = uVar18;
  iVar28 = iVar28 + 1;
  if (iVar28 == 3) goto LAB_001360f9;
  goto LAB_00135e72;
LAB_001360f9:
  lVar30 = lVar30 + 1;
  if (lVar30 == lVar35) goto LAB_0013610f;
  goto LAB_00135e2a;
}

Assistant:

bool tetgenmesh::fillcavity(arraypool* topshells, arraypool* botshells,
                            arraypool* midfaces, arraypool* missingshs,
                            arraypool* topnewtets, arraypool* botnewtets,
                            triface* crossedge)
{
  arraypool *cavshells;
  triface bdrytet, neightet, *parytet;
  triface searchtet, spintet;
  face *parysh;
  face checkseg;
  point pa, pb, pc;
  bool mflag;
  int t1ver;
  int i, j;

  // Connect newtets to tets outside the cavity.  These connections are needed
  //   for identifying the middle faces (which belong to R).
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        // Get a temp subface.
        parysh = (face *) fastlookup(cavshells, i);
        // Get the boundary tet outside the cavity (saved in sh[0]).
        decode(parysh->sh[0], bdrytet);
        pa = org(bdrytet);
        pb = dest(bdrytet);
        pc = apex(bdrytet);
        // Get the adjacent new tet inside the cavity.
        stpivot(*parysh, neightet);
        // Mark neightet as an interior tet of this cavity.
        infect(neightet);
        // Connect the two tets (the old connections are replaced).
        bond(bdrytet, neightet); 
        tsdissolve(neightet); // Clear the pointer to tmpsh.
        // Update the point-to-tets map.
        setpoint2tet(pa, (tetrahedron) neightet.tet);
        setpoint2tet(pb, (tetrahedron) neightet.tet);
        setpoint2tet(pc, (tetrahedron) neightet.tet);
      } // i
    } // if (cavshells != NULL)
  } // j

  if (crossedge != NULL) {
    // Glue top and bottom tets at their common facet.
    triface toptet, bottet, spintet, *midface;
    point pd, pe;
    REAL ori;
    int types[2], poss[4];
    int interflag;
    int bflag;

    mflag = false;
    pd = org(*crossedge);
    pe = dest(*crossedge);

    // Search the first (middle) face in R. 
    // Since R may be non-convex, we must make sure that the face is in the
    //   interior of R.  We search a face in 'topnewtets' whose three vertices
    //   are on R and it intersects 'crossedge' in its interior. Then search
    //   a matching face in 'botnewtets'.
    for (i = 0; i < topnewtets->objects && !mflag; i++) {
      searchtet = * (triface *) fastlookup(topnewtets, i);
      for (searchtet.ver = 0; searchtet.ver < 4 && !mflag; searchtet.ver++) {
        pa = org(searchtet);
        if (pmarktested(pa)) {
          pb = dest(searchtet);
          if (pmarktested(pb)) {
            pc = apex(searchtet);
            if (pmarktested(pc)) {
              // Check if this face intersects [d,e].
              interflag = tri_edge_test(pa,pb,pc,pd,pe,NULL,1,types,poss);
              if (interflag == 2) {
                // They intersect at a single point. Found.
                toptet = searchtet;
                // The face lies in the interior of R.
                // Get the tet (in topnewtets) which lies above R.
                ori = orient3d(pa, pb, pc, pd);
                if (ori < 0) {
                  fsymself(toptet);
                  pa = org(toptet);
                  pb = dest(toptet);
                } else if (ori == 0) {
                  terminatetetgen(this, 2);
                }
                // Search the face [b,a,c] in 'botnewtets'.
                for (j = 0; j < botnewtets->objects; j++) {
                  neightet = * (triface *) fastlookup(botnewtets, j);                  
                  // Is neightet contains 'b'.
                  if ((point) neightet.tet[4] == pb) {
                    neightet.ver = 11;
                  } else if ((point) neightet.tet[5] == pb) {
                    neightet.ver = 3;
                  } else if ((point) neightet.tet[6] == pb) {
                    neightet.ver = 7;
                  } else if ((point) neightet.tet[7] == pb) {
                    neightet.ver = 0;
                  } else {
                    continue;
                  }
                  // Is the 'neightet' contains edge [b,a].
                  if (dest(neightet) == pa) {
                    // 'neightet' is just the edge.
                  } else if (apex(neightet) == pa) {
                    eprevesymself(neightet);
                  } else if (oppo(neightet) == pa) {
                    esymself(neightet);
                    enextself(neightet);
                  } else {
                    continue;
                  }
                  // Is 'neightet' the face [b,a,c]. 
                  if (apex(neightet) == pc) {
                    bottet = neightet;
                    mflag = true;
                    break;
                  }
                } // j
              } // if (interflag == 2)
            } // pc
          } // pb
        } // pa
      } // toptet.ver
    } // i

    if (mflag) {
      // Found a pair of matched faces in 'toptet' and 'bottet'.
      bond(toptet, bottet);
      // Both are interior tets.
      infect(toptet);
      infect(bottet);
      // Add this face into search list.
      markface(toptet);
      midfaces->newindex((void **) &parytet);
      *parytet = toptet;
    } else {
      // No pair of 'toptet' and 'bottet'.
      toptet.tet = NULL;
      // Randomly split an interior edge of R.
      i = randomnation(missingshs->objects - 1);
      recentsh = * (face *) fastlookup(missingshs, i);
    }

    // Find other middle faces, connect top and bottom tets.
    for (i = 0; i < midfaces->objects && mflag; i++) {
      // Get a matched middle face [a, b, c]
      midface = (triface *) fastlookup(midfaces, i);
      // Check the neighbors at the edges of this face. 
      for (j = 0; j < 3 && mflag; j++) {
        toptet = *midface;
        bflag = false;
        while (1) {
          // Go to the next face in the same tet.
          esymself(toptet);
          pc = apex(toptet);
          if (pmarktested(pc)) {
            break; // Find a subface.
          }
          if (pc == dummypoint) {
            terminatetetgen(this, 2); // Check this case.
            break; // Find a subface.
          }
          // Go to the adjacent tet.
          fsymself(toptet);
          // Do we walk outside the cavity? 
          if (!marktested(toptet)) {
            // Yes, the adjacent face is not a middle face.
            bflag = true; break; 
          }
        }
        if (!bflag) {
          if (!facemarked(toptet)) {
            fsym(*midface, bottet);
            spintet = bottet;
            while (1) {
              esymself(bottet);
              pd = apex(bottet);
              if (pd == pc) break; // Face matched.
              fsymself(bottet);
              if (bottet.tet == spintet.tet) {
                // Not found a matched bottom face.
                mflag = false;
                break;
              }
            } // while (1)
            if (mflag) {
              if (marktested(bottet)) {
                // Connect two tets together.
                bond(toptet, bottet);
                // Both are interior tets.
                infect(toptet);
                infect(bottet);
                // Add this face into list.
                markface(toptet);
                midfaces->newindex((void **) &parytet);
                *parytet = toptet;
              }
              else {
                // The 'bottet' is not inside the cavity! 
                terminatetetgen(this, 2); // Check this case
              }
            } else { // mflag == false
              // Adjust 'toptet' and 'bottet' to be the crossing edges.
              fsym(*midface, bottet);
              spintet = bottet;
              while (1) {
                esymself(bottet);
                pd = apex(bottet);
                if (pmarktested(pd)) {
                  // assert(pd != pc);
                  // Let 'toptet' be [a,b,c,#], and 'bottet' be [b,a,d,*].
                  // Adjust 'toptet' and 'bottet' to be the crossing edges.
                  // Test orient3d(b,c,#,d).
                  ori = orient3d(dest(toptet), pc, oppo(toptet), pd);
                  if (ori < 0) {
                    // Edges [a,d] and [b,c] cross each other.
                    enextself(toptet); // [b,c]
                    enextself(bottet); // [a,d]
                  } else if (ori > 0) {
                    // Edges [a,c] and [b,d] cross each other. 
                    eprevself(toptet); // [c,a]
                    eprevself(bottet); // [d,b]
                  } else {
                    // b,c,#,and d are coplanar!.
                    terminatetetgen(this, 2); //assert(0);
                  }
                  break; // Not matched
                }
                fsymself(bottet);
              }
            } // if (!mflag)
          } // if (!facemarked(toptet))
        } // if (!bflag)
        enextself(*midface);
      } // j
    } // i

    if (mflag) {
      if (b->verbose > 2) {
        printf("      Found %ld middle subfaces.\n", midfaces->objects);
      }
      face oldsh, newsh, casout, casin, neighsh;

      oldsh = * (face *) fastlookup(missingshs, 0);

      // Create new subfaces to fill the region R.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        unmarkface(*midface);
        makeshellface(subfaces, &newsh);
        setsorg(newsh, org(*midface));
        setsdest(newsh, dest(*midface));
        setsapex(newsh, apex(*midface));
        // The new subface gets its markers from the old one.
        setshellmark(newsh, shellmark(oldsh));
        if (checkconstraints) {
          setareabound(newsh, areabound(oldsh));
        }
        if (useinsertradius) {
          setfacetindex(newsh, getfacetindex(oldsh));
        }
        // Connect the new subface to adjacent tets.
        tsbond(*midface, newsh);
        fsym(*midface, neightet);
        sesymself(newsh);
        tsbond(neightet, newsh);
      }

      // Connect new subfaces together and to the bdry of R.
      // Delete faked segments.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        for (j = 0; j < 3; j++) {
          tspivot(*midface, newsh);
          spivot(newsh, casout);
          if (casout.sh == NULL) {
            // Search its neighbor.
            fnext(*midface, searchtet);
            while (1) {
              // (1) First check if this side is a bdry edge of R.
              tsspivot1(searchtet, checkseg);
              if (checkseg.sh != NULL) {
                // It's a bdry edge of R.
                // Get the old subface.
                checkseg.shver = 0;
                spivot(checkseg, oldsh);
                if (sinfected(checkseg)) {
                  // It's a faked segment. Delete it.
                  spintet = searchtet;
                  while (1) {
                    tssdissolve1(spintet);
                    fnextself(spintet);
                    if (spintet.tet == searchtet.tet) break;
                  }
                  shellfacedealloc(subsegs, checkseg.sh);
                  ssdissolve(oldsh);
                  checkseg.sh = NULL;
                }
                spivot(oldsh, casout);
                if (casout.sh != NULL) {
                  casin = casout;
                  if (checkseg.sh != NULL) {
                    // Make sure that the subface has the right ori at the 
                    //   segment.
                    checkseg.shver = 0;
                    if (sorg(newsh) != sorg(checkseg)) {
                      sesymself(newsh);
                    }
                    spivot(casin, neighsh);
                    while (neighsh.sh != oldsh.sh) {
                      casin = neighsh;
                      spivot(casin, neighsh);
                    }
                  }
                  sbond1(newsh, casout);
                  sbond1(casin, newsh);
                }
                if (checkseg.sh != NULL) {
                  ssbond(newsh, checkseg);
                }
                break;
              } // if (checkseg.sh != NULL)
              // (2) Second check if this side is an interior edge of R.
              tspivot(searchtet, neighsh);
              if (neighsh.sh != NULL) {
                // Found an adjacent subface of newsh (an interior edge).
                sbond(newsh, neighsh);
                break;
              }
              fnextself(searchtet);
            } // while (1)
          } // if (casout.sh == NULL)
          enextself(*midface);
        } // j
      } // i

      // Delete old subfaces.
      for (i = 0; i < missingshs->objects; i++) {
        parysh = (face *) fastlookup(missingshs, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    } else {
      if (toptet.tet != NULL) {
        // Faces at top and bottom are not matched. 
        // Choose a Steiner point in R.
        // Split one of the crossing edges.
        pa = org(toptet);
        pb = dest(toptet);
        pc = org(bottet);
        pd = dest(bottet);
        // Search an edge in R which is either [a,b] or [c,d].
        // Reminder:  Subfaces in this list 'missingshs', except the first
        //   one, represents an interior edge of R. 
        for (i = 1; i < missingshs->objects; i++) {
          parysh = (face *) fastlookup(missingshs, i);
          if (((sorg(*parysh) == pa) && (sdest(*parysh) == pb)) ||
              ((sorg(*parysh) == pb) && (sdest(*parysh) == pa))) break;
          if (((sorg(*parysh) == pc) && (sdest(*parysh) == pd)) ||
              ((sorg(*parysh) == pd) && (sdest(*parysh) == pc))) break;
        }
        if (i < missingshs->objects) {
          // Found. Return it.
          recentsh = *parysh;
        } else {
          terminatetetgen(this, 2); //assert(0);
        }
      }
    }

    midfaces->restart();
  } else {
    mflag = true;
  } 

  // Delete the temp subfaces.
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    }
  }

  topshells->restart();
  if (botshells != NULL) {
    botshells->restart();
  }

  return mflag;
}